

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *
cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript
          (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *__return_storage_ptr__,
          Script *multisig_script,uint32_t *require_num)

{
  undefined4 uVar1;
  uint32_t *puVar2;
  undefined4 uVar3;
  pointer __dest;
  CfdException *pCVar4;
  long lVar5;
  ulong uVar6;
  size_t __n;
  ScriptElement require_num_element;
  int64_t contain_pubkey_num;
  IteratorWrapper<cfd::core::ScriptElement> itr;
  ScriptElement element;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> elements;
  ScriptElementType local_23c;
  ByteData local_238;
  undefined1 local_220 [96];
  undefined1 local_1c0 [64];
  pointer local_180;
  pointer local_178;
  long local_168;
  long local_160;
  CfdSourceLocation local_158;
  uint32_t *local_140;
  string local_138;
  IteratorWrapper<cfd::core::ScriptElement> local_118;
  undefined1 local_c0 [88];
  long local_68;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_60;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&local_48,&multisig_script->script_stack_);
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::vector
            (&local_60,&local_48);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"Invalid script element access","");
  IteratorWrapper<cfd::core::ScriptElement>::IteratorWrapper(&local_118,&local_60,&local_138,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_60);
  do {
    while( true ) {
      if (*(long *)(local_c0 + (ulong)local_118.reverse_ * 8 + -0x38) ==
          *(long *)(local_c0 + (ulong)(local_118.reverse_ ^ 1) * 8 + -0x50)) goto LAB_0044aa55;
      IteratorWrapper<cfd::core::ScriptElement>::next((ScriptElement *)local_c0,&local_118);
      uVar3 = local_c0._24_4_;
      uVar1 = ScriptOperator::OP_CHECKMULTISIGVERIFY._8_4_;
      if (local_c0._8_4_ == kElementOpCode) break;
      ScriptElement::~ScriptElement((ScriptElement *)local_c0);
    }
    if (local_c0._24_4_ == ScriptOperator::OP_CHECKMULTISIG._8_4_) {
      ScriptElement::~ScriptElement((ScriptElement *)local_c0);
      break;
    }
    ScriptElement::~ScriptElement((ScriptElement *)local_c0);
  } while (uVar3 != uVar1);
LAB_0044aa55:
  if (*(long *)(local_c0 + (ulong)local_118.reverse_ * 8 + -0x38) ==
      *(long *)(local_c0 + (ulong)(local_118.reverse_ ^ 1) * 8 + -0x50)) {
    local_1c0._0_8_ = "cfdcore_script.cpp";
    local_1c0._8_4_ = 0x68c;
    local_1c0._16_8_ = "ExtractPubkeysFromMultisigScript";
    Script::ToString_abi_cxx11_((string *)local_c0,multisig_script);
    logger::log<std::__cxx11::string&>
              ((CfdSourceLocation *)local_1c0,kCfdLogLevelWarning,
               "Multisig opcode (OP_CHECKMULTISIG|VERIFY) not found in redeem script: script={}",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0);
    if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
      operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
    }
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_c0._0_8_ = local_c0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_c0,
               "OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) not found in redeem script.","");
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_c0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_140 = require_num;
  IteratorWrapper<cfd::core::ScriptElement>::next((ScriptElement *)local_c0,&local_118);
  if (((local_c0._8_4_ != kElementNumber) && (local_68 == 0)) && (local_c0._24_4_ != kOpFalse)) {
    local_220._0_8_ = "cfdcore_script.cpp";
    local_220._8_4_ = 0x69a;
    local_220._16_8_ = "ExtractPubkeysFromMultisigScript";
    Script::ToString_abi_cxx11_((string *)local_1c0,multisig_script);
    logger::log<std::__cxx11::string&>
              ((CfdSourceLocation *)local_220,kCfdLogLevelWarning,
               "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script. Missing contain pubkey number.: script={}"
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
    if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
      operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
    }
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1c0._0_8_ = local_1c0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c0,
               "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input in redeem script. Missing contain pubkey number."
               ,"");
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_1c0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_160 = local_68;
  if (0 < local_68) {
    lVar5 = 0;
    do {
      if (*(long *)(local_c0 + (ulong)local_118.reverse_ * 8 + -0x38) ==
          *(long *)(local_c0 + (ulong)(local_118.reverse_ ^ 1) * 8 + -0x50)) {
        local_220._0_8_ = "cfdcore_script.cpp";
        local_220._8_4_ = 0x6a9;
        local_220._16_8_ = "ExtractPubkeysFromMultisigScript";
        Script::ToString_abi_cxx11_((string *)local_1c0,multisig_script);
        logger::log<long&,std::__cxx11::string&>
                  ((CfdSourceLocation *)local_220,kCfdLogLevelWarning,
                   "Not found enough pubkeys in redeem script.: require_pubkey_num={}, script={}",
                   &local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
        if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
          operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
        }
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_1c0._0_8_ = local_1c0 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c0,"Not found enough pubkeys in redeem script.","");
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_1c0);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      IteratorWrapper<cfd::core::ScriptElement>::next((ScriptElement *)local_1c0,&local_118);
      if (local_1c0._8_4_ != kElementBinary) {
        local_158.filename = "cfdcore_script.cpp";
        local_158.line = 0x6b6;
        local_158.funcname = "ExtractPubkeysFromMultisigScript";
        local_23c = local_1c0._8_4_;
        ScriptElement::ToString_abi_cxx11_((string *)local_220,(ScriptElement *)local_1c0);
        logger::log<cfd::core::ScriptElementType&,std::__cxx11::string&>
                  (&local_158,kCfdLogLevelWarning,
                   "Invalid script element. Not binary element.: ScriptElementType={}, data={}",
                   &local_23c,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
        if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
          operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
        }
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        local_220._0_8_ = local_220 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_220,"Invalid ScriptElementType.(not binary)","");
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_220);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar6 = (long)local_178 - (long)local_180;
      if (uVar6 == 0) {
        __dest = (pointer)0x0;
      }
      else {
        if ((long)uVar6 < 0) {
          ::std::__throw_bad_alloc();
        }
        __dest = (pointer)operator_new(uVar6);
      }
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = __dest + uVar6;
      __n = (long)local_178 - (long)local_180;
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = __dest;
      if (__n != 0) {
        local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = __dest;
        memmove(__dest,local_180,__n);
      }
      local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = __dest + __n;
      Pubkey::Pubkey((Pubkey *)local_220,&local_238);
      ::std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::
      emplace_back<cfd::core::Pubkey>(__return_storage_ptr__,(Pubkey *)local_220);
      if ((_func_int **)local_220._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_220._0_8_,local_220._16_8_ - local_220._0_8_);
      }
      if (local_238.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_238.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_238.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      ScriptElement::~ScriptElement((ScriptElement *)local_1c0);
      lVar5 = lVar5 + 1;
    } while (lVar5 < local_160);
  }
  local_220._0_4_ = 0xff;
  ScriptElement::ScriptElement((ScriptElement *)local_1c0,(ScriptType *)local_220);
  puVar2 = local_140;
  if (*(long *)(local_c0 + (ulong)local_118.reverse_ * 8 + -0x38) !=
      *(long *)(local_c0 + (ulong)(local_118.reverse_ ^ 1) * 8 + -0x50)) {
    IteratorWrapper<cfd::core::ScriptElement>::next((ScriptElement *)local_220,&local_118);
    ScriptElement::operator=((ScriptElement *)local_1c0,(ScriptElement *)local_220);
    ScriptElement::~ScriptElement((ScriptElement *)local_220);
  }
  if (((local_1c0._8_4_ == kElementNumber || local_168 != 0) && (local_1c0._8_4_ == kElementOpCode))
     && (0 < local_168)) {
    if (puVar2 != (uint32_t *)0x0) {
      *puVar2 = (uint32_t)local_168;
    }
    ::std::
    __reverse<__gnu_cxx::__normal_iterator<cfd::core::Pubkey*,std::vector<cfd::core::Pubkey,std::allocator<cfd::core::Pubkey>>>>
              ((__return_storage_ptr__->
               super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__return_storage_ptr__->
               super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>)._M_impl.
               super__Vector_impl_data._M_finish);
    ScriptElement::~ScriptElement((ScriptElement *)local_1c0);
    ScriptElement::~ScriptElement((ScriptElement *)local_c0);
    IteratorWrapper<cfd::core::ScriptElement>::~IteratorWrapper(&local_118);
    ::std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              (&local_48);
    return __return_storage_ptr__;
  }
  local_158.filename = "cfdcore_script.cpp";
  local_158.line = 0x6cb;
  local_158.funcname = "ExtractPubkeysFromMultisigScript";
  Script::ToString_abi_cxx11_((string *)local_220,multisig_script);
  logger::log<std::__cxx11::string&>
            (&local_158,kCfdLogLevelWarning,
             "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script. Missing require signature number.: script={}"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
  if ((undefined1 *)local_220._0_8_ != local_220 + 0x10) {
    operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
  }
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_220._0_8_ = local_220 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_220,
             "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input in redeem script. Missing require signature number."
             ,"");
  CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_220);
  __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<Pubkey> ScriptUtil::ExtractPubkeysFromMultisigScript(
    const Script& multisig_script, uint32_t* require_num) {
  std::vector<Pubkey> pubkeys;
  const std::vector<ScriptElement> elements = multisig_script.GetElementList();

  // find OP_CHECKMULTISIG or OP_CHECKMULTISIGVERIFY
  IteratorWrapper<ScriptElement> itr = IteratorWrapper<ScriptElement>(
      elements, "Invalid script element access", true);
  // search OP_CHECKMULTISIG(or VERIFY)
  while (itr.hasNext()) {
    ScriptElement element = itr.next();
    if (!element.IsOpCode()) {
      continue;
    }
    if (element.GetOpCode() == ScriptOperator::OP_CHECKMULTISIG ||
        element.GetOpCode() == ScriptOperator::OP_CHECKMULTISIGVERIFY) {
      break;
    }
  }
  // target opcode not found
  if (!itr.hasNext()) {
    warn(
        CFD_LOG_SOURCE,
        "Multisig opcode (OP_CHECKMULTISIG|VERIFY) not found"
        " in redeem script: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) not found"
        " in redeem script.");
  }

  // get contain pubkey num
  const ScriptElement& op_m = itr.next();
  if (!op_m.IsNumber()) {
    warn(
        CFD_LOG_SOURCE,
        "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script."
        " Missing contain pubkey number.: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input"
        " in redeem script. Missing contain pubkey number.");
  }

  // set pubkey to vector(reverse data)
  int64_t contain_pubkey_num = op_m.GetNumber();
  for (int64_t i = 0; i < contain_pubkey_num; ++i) {
    if (!itr.hasNext()) {
      warn(
          CFD_LOG_SOURCE,
          "Not found enough pubkeys in redeem script.: "
          "require_pubkey_num={}, script={}",
          contain_pubkey_num, multisig_script.ToString());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Not found enough pubkeys in redeem script.");
    }

    const ScriptElement& pubkey_element = itr.next();
    // check script element type
    if (!pubkey_element.IsBinary()) {
      warn(
          CFD_LOG_SOURCE,
          "Invalid script element. Not binary element.: "
          "ScriptElementType={}, data={}",
          pubkey_element.GetType(), pubkey_element.ToString());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid ScriptElementType.(not binary)");
    }

    // push pubkey data
    pubkeys.push_back(Pubkey(pubkey_element.GetBinaryData()));
  }

  // check opcode(require signature num)
  ScriptElement require_num_element(ScriptType::kOpInvalidOpCode);
  if (itr.hasNext()) {
    require_num_element = itr.next();
  }
  if (!(require_num_element.IsNumber() && require_num_element.IsOpCode()) ||
      (require_num_element.GetNumber() <= 0)) {
    warn(
        CFD_LOG_SOURCE,
        "Invalid OP_CHECKMULTISIG(VERIFY) input in redeem script."
        " Missing require signature number.: script={}",
        multisig_script.ToString());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid OP_CHCKMULTISIG(OP_CHECKMULTISIGVERIFY) input"
        " in redeem script. Missing require signature number.");
  }

  if (require_num) {
    *require_num = static_cast<uint32_t>(require_num_element.GetNumber());
  }
  // return reverse pubkey vector
  std::reverse(std::begin(pubkeys), std::end(pubkeys));
  return pubkeys;
}